

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O0

void __thiscall avro::BufferReader::incrementChunk(BufferReader *this,size_type howmuch)

{
  size_type sVar1;
  pointer this_00;
  size_type sVar2;
  long in_RSI;
  _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>
  *in_RDI;
  
  *(long *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) - in_RSI;
  *(long *)(in_RDI + 0x40) = in_RSI + *(long *)(in_RDI + 0x40);
  sVar1 = *(size_type *)(in_RDI + 0x40);
  this_00 = std::
            _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>
            ::operator->(in_RDI + 0x10);
  sVar2 = detail::Chunk::dataSize(this_00);
  if (sVar1 == sVar2) {
    *(undefined8 *)(in_RDI + 0x40) = 0;
    std::
    _Deque_iterator<avro::detail::Chunk,_const_avro::detail::Chunk_&,_const_avro::detail::Chunk_*>::
    operator++(in_RDI);
  }
  return;
}

Assistant:

void incrementChunk(size_type howmuch) {
        bytesRemaining_ -= howmuch;
        chunkPos_ += howmuch;
        if(chunkPos_ == iter_->dataSize()) {
            chunkPos_ = 0;
            ++iter_;
        }
    }